

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::
constraintsSecondPartialDerivativeWRTControlSparsity
          (OptimalControlProblem *this,SparsityStructure *controlSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  size_t numberOfRows;
  size_t numberOfColumns;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp;
  ostringstream errorMsg;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  p_Var3 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0014a306:
  if ((_Rb_tree_header *)p_Var3 !=
      &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header) goto code_r0x0014a312;
  SparsityStructure::clear(&this->m_pimpl->constraintsControlHessianSparsity);
  pOVar1 = this->m_pimpl;
  for (p_Var4 = (pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    SparsityStructure::merge
              (&this->m_pimpl->constraintsControlHessianSparsity,
               (SparsityStructure *)(*(long *)(p_Var4 + 2) + 600));
  }
  goto LAB_0014a3da;
code_r0x0014a312:
  bVar2 = ConstraintsGroup::constraintsSecondPartialDerivativeWRTControlSparsity
                    ((ConstraintsGroup *)**(undefined8 **)(p_Var3 + 2),
                     (SparsityStructure *)(*(undefined8 **)(p_Var3 + 2) + 0x4b));
  *(bool *)(*(long *)(p_Var3 + 2) + 0x329) = bVar2;
  p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  if (!bVar2) {
    if ((this->m_pimpl->dynamicalSystem).
        super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Not all groups have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown."
                 ,0xa5);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("OptimalControlProblem","constraintsSecondPartialDerivativeWRTControlSparsity",
                 (char *)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar2 = false;
    }
    else {
      SparsityStructure::clear(&this->m_pimpl->constraintsControlHessianSparsity);
      pOVar1 = this->m_pimpl;
      numberOfRows = DynamicalSystem::controlSpaceSize
                               ((pOVar1->dynamicalSystem).
                                super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      numberOfColumns =
           DynamicalSystem::controlSpaceSize
                     ((this->m_pimpl->dynamicalSystem).
                      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
      SparsityStructure::addDenseBlock
                (&pOVar1->constraintsControlHessianSparsity,0,0,numberOfRows,numberOfColumns);
LAB_0014a3da:
      pOVar1 = this->m_pimpl;
      if (&pOVar1->constraintsControlHessianSparsity != controlSparsity) {
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)controlSparsity,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&pOVar1->constraintsControlHessianSparsity);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&controlSparsity->m_nonZeroElementRows,
                 &(pOVar1->constraintsControlHessianSparsity).m_nonZeroElementRows);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&controlSparsity->m_nonZeroElementColumns,
                 &(pOVar1->constraintsControlHessianSparsity).m_nonZeroElementColumns);
      bVar2 = true;
    }
    return bVar2;
  }
  goto LAB_0014a306;
}

Assistant:

bool OptimalControlProblem::constraintsSecondPartialDerivativeWRTControlSparsity(SparsityStructure &controlSparsity)
        {
            bool allHaveSparsity = true;

            auto group = m_pimpl->constraintsGroups.begin();

            while (allHaveSparsity && group != m_pimpl->constraintsGroups.end()) {
                group->second->hasControlHessianSparsity =
                    group->second->group_ptr->constraintsSecondPartialDerivativeWRTControlSparsity(group->second->controlHessianSparsity);
                allHaveSparsity &= group->second->hasControlHessianSparsity;
                group++;
            }

            if (allHaveSparsity) {
                m_pimpl->constraintsControlHessianSparsity.clear();

                for (auto& groupPtr : m_pimpl->constraintsGroups) {
                    m_pimpl->constraintsControlHessianSparsity.merge(groupPtr.second->controlHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->constraintsControlHessianSparsity.clear();
                    m_pimpl->constraintsControlHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->controlSpaceSize(), m_pimpl->dynamicalSystem->controlSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all groups have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown.";
                    reportError("OptimalControlProblem", "constraintsSecondPartialDerivativeWRTControlSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            controlSparsity = m_pimpl->constraintsControlHessianSparsity;
            return true;
        }